

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_0::PrintPresenceCheck
               (Formatter *format,FieldDescriptor *field,
               vector<int,_std::allocator<int>_> *has_bit_indices,Printer *printer,
               int *cached_has_word_index)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  AlphaNum *a;
  AlphaNum *this;
  Hex HVar4;
  AlphaNum local_70;
  undefined1 local_40 [8];
  string mask;
  
  if (*(char *)(*(long *)(field + 0x78) + 0x4f) == '\0') {
    pcVar3 = FieldDescriptor::index(field,(char *)field,(int)has_bit_indices);
    iVar1 = (has_bit_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[(int)pcVar3];
    iVar2 = iVar1 / 0x20;
    if (*(int *)printer != iVar2) {
      *(int *)printer = iVar2;
      Formatter::operator()(format,"cached_has_bits = _has_bits_[$1$];\n",(int *)printer);
    }
    HVar4.value = 1L << ((byte)iVar1 & 0x1f);
    HVar4._8_8_ = 8;
    google::protobuf::strings::AlphaNum::AlphaNum(&local_70,HVar4);
    StrCat_abi_cxx11_((string *)local_40,(protobuf *)&local_70,a);
    Formatter::operator()(format,"if (cached_has_bits & 0x$1$u) {\n",(string *)local_40);
    this = (AlphaNum *)local_40;
  }
  else {
    FieldName_abi_cxx11_((string *)&local_70,(cpp *)field,(FieldDescriptor *)has_bit_indices);
    Formatter::operator()
              (format,"if (has_$1$()) {\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    this = &local_70;
  }
  std::__cxx11::string::~string((string *)this);
  Formatter::Indent(format);
  return;
}

Assistant:

void PrintPresenceCheck(const Formatter& format, const FieldDescriptor* field,
                        const std::vector<int>& has_bit_indices,
                        io::Printer* printer, int* cached_has_word_index) {
  if (!field->options().weak()) {
    int has_bit_index = has_bit_indices[field->index()];
    if (*cached_has_word_index != (has_bit_index / 32)) {
      *cached_has_word_index = (has_bit_index / 32);
      format("cached_has_bits = _has_bits_[$1$];\n", *cached_has_word_index);
    }
    const std::string mask =
        StrCat(strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format("if (cached_has_bits & 0x$1$u) {\n", mask);
  } else {
    format("if (has_$1$()) {\n", FieldName(field));
  }
  format.Indent();
}